

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1-sw.c
# Opt level: O2

void sha1_sw_write(BinarySink *bs,void *vp,size_t len)

{
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var1;
  size_t t;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong __n;
  uint auStack_1b8 [7];
  uint local_19c;
  uint local_198 [4];
  undefined8 local_188;
  undefined8 local_180;
  uint local_178 [82];
  
  local_180 = &bs[-4].binarysink_;
  while (len != 0) {
    __n = 0x40 - (long)bs[-1].writefmtv;
    if (len < __n) {
      __n = len;
    }
    auStack_1b8[2] = 0x15c2a0;
    auStack_1b8[3] = 0;
    memcpy(bs[-1].writefmtv + (long)local_180,vp,__n);
    vp = (void *)((long)vp + __n);
    len = len - __n;
    p_Var1 = bs[-1].writefmtv;
    bs[-1].writefmtv = p_Var1 + __n;
    bs[-1].binarysink_ = (BinarySink *)((long)&(bs[-1].binarysink_)->write + __n);
    if (p_Var1 + __n == (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x40) {
      bs[-1].writefmtv = (_func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *)0x0;
      for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
        uVar3 = *(uint *)((long)bs + lVar2 * 4 + -0x50);
        local_178[lVar2] =
             uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      }
      for (lVar2 = 0x10; lVar2 != 0x50; lVar2 = lVar2 + 1) {
        uVar3 = local_198[lVar2] ^ *(uint *)((long)&local_188 + lVar2 * 4 + 4) ^
                auStack_1b8[lVar2 + 2] ^ auStack_1b8[lVar2];
        local_178[lVar2] = uVar3 << 1 | (uint)((int)uVar3 < 0);
      }
      local_19c = *(uint *)&bs[-5].binarysink_;
      local_198[0] = *(uint *)((long)&bs[-5].binarysink_ + 4);
      local_198[1] = *(uint *)&bs[-4].write;
      local_198[2] = *(uint *)((long)&bs[-4].write + 4);
      local_198[3] = *(uint *)&bs[-4].writefmtv;
      uVar3 = local_19c;
      uVar6 = local_198[0];
      uVar4 = local_198[1];
      uVar10 = local_198[2];
      uVar7 = local_198[3];
      for (lVar2 = 0x10; lVar2 != 0x60; lVar2 = lVar2 + 0x14) {
        uVar5 = uVar6 << 0x1e | uVar6 >> 2;
        uVar6 = (uVar3 << 5 | uVar3 >> 0x1b) + uVar7 + ((uVar10 ^ uVar4) & uVar6 ^ uVar10) +
                *(int *)((long)&local_188 + lVar2) + 0x5a827999;
        uVar10 = ((uVar4 ^ uVar5) & uVar3 ^ uVar4) + uVar10 + *(int *)((long)&local_188 + lVar2 + 4)
                 + 0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar3 = uVar3 << 0x1e | uVar3 >> 2;
        uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
        uVar4 = uVar4 + *(int *)((long)local_178 + lVar2 + -8) + ((uVar5 ^ uVar3) & uVar6 ^ uVar5) +
                0x5a827999 + (uVar10 * 0x20 | uVar10 >> 0x1b);
        uVar6 = uVar5 + *(int *)((long)local_178 + lVar2 + -4) + ((uVar7 ^ uVar3) & uVar10 ^ uVar3)
                + 0x5a827999 + (uVar4 * 0x20 | uVar4 >> 0x1b);
        uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
        uVar3 = uVar3 + *(int *)((long)local_178 + lVar2) + ((uVar10 ^ uVar7) & uVar4 ^ uVar7) +
                0x5a827999 + (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
      }
      for (lVar2 = 0x60; lVar2 != 0xb0; lVar2 = lVar2 + 0x14) {
        uVar5 = uVar6 << 0x1e | uVar6 >> 2;
        uVar6 = (uVar3 << 5 | uVar3 >> 0x1b) + (uVar4 ^ uVar6 ^ uVar10) + uVar7 +
                *(int *)((long)&local_188 + lVar2) + 0x6ed9eba1;
        uVar10 = (uVar3 ^ uVar4 ^ uVar5) + uVar10 + *(int *)((long)&local_188 + lVar2 + 4) +
                 0x6ed9eba1 + (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar3 = uVar3 << 0x1e | uVar3 >> 2;
        uVar4 = uVar4 + *(int *)((long)local_178 + lVar2 + -8) + (uVar5 ^ uVar3 ^ uVar6) +
                0x6ed9eba1 + (uVar10 * 0x20 | uVar10 >> 0x1b);
        uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
        uVar6 = uVar5 + *(int *)((long)local_178 + lVar2 + -4) + (uVar7 ^ uVar3 ^ uVar10) +
                0x6ed9eba1 + (uVar4 * 0x20 | uVar4 >> 0x1b);
        uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
        uVar3 = uVar3 + *(int *)((long)local_178 + lVar2) + (uVar10 ^ uVar7 ^ uVar4) + 0x6ed9eba1 +
                (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
      }
      for (lVar2 = 0xb0; lVar2 != 0x100; lVar2 = lVar2 + 0x14) {
        iVar8 = (uVar3 << 5 | uVar3 >> 0x1b) + uVar7 + ((uVar4 | uVar6) & uVar10 | uVar4 & uVar6) +
                *(int *)((long)&local_188 + lVar2);
        uVar9 = iVar8 + 0x8f1bbcdc;
        uVar6 = uVar6 << 0x1e | uVar6 >> 2;
        uVar5 = uVar3 << 0x1e | uVar3 >> 2;
        uVar11 = ((uVar6 | uVar3) & uVar4 | uVar6 & uVar3) + uVar10 +
                 *(int *)((long)&local_188 + lVar2 + 4) + -0x70e44324 +
                 (uVar9 * 0x20 | uVar9 >> 0x1b);
        uVar7 = iVar8 * 0x40000000 | uVar9 >> 2;
        uVar3 = uVar4 + *(int *)((long)local_178 + lVar2 + -8) +
                ((uVar9 | uVar5) & uVar6 | uVar9 & uVar5) + -0x70e44324 +
                (uVar11 * 0x20 | uVar11 >> 0x1b);
        uVar10 = uVar11 * 0x40000000 | uVar11 >> 2;
        uVar6 = uVar6 + *(int *)((long)local_178 + lVar2 + -4) +
                ((uVar11 | uVar7) & uVar5 | uVar11 & uVar7) + -0x70e44324 +
                (uVar3 * 0x20 | uVar3 >> 0x1b);
        uVar4 = uVar3 * 0x40000000 | uVar3 >> 2;
        uVar3 = uVar5 + *(int *)((long)local_178 + lVar2) +
                ((uVar3 | uVar10) & uVar7 | uVar3 & uVar10) + -0x70e44324 +
                (uVar6 * 0x20 | uVar6 >> 0x1b);
      }
      for (lVar2 = 0x100; lVar2 != 0x150; lVar2 = lVar2 + 0x14) {
        uVar5 = uVar6 << 0x1e | uVar6 >> 2;
        uVar6 = (uVar3 << 5 | uVar3 >> 0x1b) + (uVar4 ^ uVar6 ^ uVar10) + uVar7 +
                *(int *)((long)&local_188 + lVar2) + 0xca62c1d6;
        uVar10 = (uVar3 ^ uVar4 ^ uVar5) + uVar10 + *(int *)((long)&local_188 + lVar2 + 4) +
                 -0x359d3e2a + (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar3 = uVar3 << 0x1e | uVar3 >> 2;
        uVar4 = uVar4 + *(int *)((long)local_178 + lVar2 + -8) + (uVar5 ^ uVar3 ^ uVar6) +
                -0x359d3e2a + (uVar10 * 0x20 | uVar10 >> 0x1b);
        uVar7 = uVar6 * 0x40000000 | uVar6 >> 2;
        uVar6 = uVar5 + *(int *)((long)local_178 + lVar2 + -4) + (uVar7 ^ uVar3 ^ uVar10) +
                -0x359d3e2a + (uVar4 * 0x20 | uVar4 >> 0x1b);
        uVar10 = uVar10 * 0x40000000 | uVar10 >> 2;
        uVar3 = uVar3 + *(int *)((long)local_178 + lVar2) + (uVar10 ^ uVar7 ^ uVar4) + -0x359d3e2a +
                (uVar6 * 0x20 | uVar6 >> 0x1b);
        uVar4 = uVar4 * 0x40000000 | uVar4 >> 2;
      }
      *(uint *)&bs[-5].binarysink_ = uVar3 + local_19c;
      *(uint *)((long)&bs[-5].binarysink_ + 4) = uVar6 + local_198[0];
      *(uint *)&bs[-4].write = uVar4 + local_198[1];
      *(uint *)((long)&bs[-4].write + 4) = uVar10 + local_198[2];
      *(uint *)&bs[-4].writefmtv = uVar7 + local_198[3];
      auStack_1b8[2] = 0x15c6b8;
      auStack_1b8[3] = 0;
      local_188 = len;
      smemclr(local_178,0x140);
      len = local_188;
    }
  }
  return;
}

Assistant:

static void sha1_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha1_sw *s = BinarySink_DOWNCAST(bs, sha1_sw);

    while (len > 0)
        if (sha1_block_write(&s->blk, &vp, &len))
            sha1_sw_block(s->core, s->blk.block);
}